

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true>::push_back
          (SmallVectorTemplateBase<std::pair<llvm::StringRef,_unsigned_int>,_true> *this,
          pair<llvm::StringRef,_unsigned_int> *Elt)

{
  undefined8 *puVar1;
  void *pvVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar4 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
      super_SmallVectorBase.Capacity <= uVar4) {
    grow(this,0);
    uVar4 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
            super_SmallVectorBase.Size;
  }
  pvVar2 = (this->super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>).
           super_SmallVectorBase.BeginX;
  *(undefined8 *)((long)pvVar2 + (ulong)uVar4 * 0x18 + 0x10) = *(undefined8 *)&Elt->second;
  sVar3 = (Elt->first).Length;
  puVar1 = (undefined8 *)((long)pvVar2 + (ulong)uVar4 * 0x18);
  *puVar1 = (Elt->first).Data;
  puVar1[1] = sVar3;
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->
                    super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_unsigned_int>,_void>)
                    .super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }